

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_L_mult_inplace(m256v *LU,m256v *X_inout)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  int rt;
  
  lVar3 = (long)LU->n_row;
  while (0 < lVar3) {
    lVar1 = lVar3 + -1;
    rt = (int)lVar1;
    if (LU->n_col < lVar3) {
      m256v_clear_row(X_inout,rt);
      uVar2 = LU->n_col;
      while (lVar3 = lVar1, 0 < (int)uVar2) {
        uVar2 = uVar2 - 1;
        m256v_multadd_row(X_inout,uVar2,LU->e[(ulong)uVar2 + LU->rstride * lVar1],X_inout,rt);
      }
    }
    else {
      for (uVar2 = (int)lVar3 - 2; lVar3 = lVar1, -1 < (int)uVar2; uVar2 = uVar2 - 1) {
        m256v_multadd_row(X_inout,uVar2,LU->e[(ulong)uVar2 + LU->rstride * lVar1],X_inout,rt);
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}